

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::RenderLayers(CEditor *this,CUIRect ToolBox,CUIRect View)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  CLayerGroup **ppCVar4;
  ITextRender *pIVar5;
  CUI *pCVar6;
  IInput *pIVar7;
  CLayer **ppCVar8;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar9;
  float in_XMM1_Db;
  int Result_1;
  float FontSize_1;
  int i;
  int Result;
  float FontSize;
  int g_1;
  float LayerCur;
  float LayerStopAt;
  float LayerStartAt;
  int ScrollNum;
  float ScrollDifference;
  int g;
  float LayersHeight;
  CUIRect SaveCheck;
  CUIRect VisibleToggle;
  CUIRect Scroll;
  CUIRect Button;
  CUIRect Slot;
  CUIRect LayersBox;
  char aBuf [64];
  char *in_stack_fffffffffffffe08;
  char *pcVar10;
  code *pcVar11;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar12;
  float in_stack_fffffffffffffe14;
  CUIRect *in_stack_fffffffffffffe18;
  CUI *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  CUI *in_stack_fffffffffffffe30;
  int Checked;
  CUIRect *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  CEditor *in_stack_fffffffffffffe48;
  bool *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  byte bVar13;
  int local_fc;
  uint local_f0;
  float local_ec;
  float local_e4;
  int local_d8;
  float local_d4;
  float local_80;
  float local_70;
  IStorage *local_8;
  
  local_8 = *(IStorage **)(in_FS_OFFSET + 0x28);
  local_d4 = 12.0;
  for (local_d8 = 0;
      iVar2 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size
                        (&(in_RDI->m_Map).m_lGroups), local_d8 < iVar2; local_d8 = local_d8 + 1) {
    local_d4 = local_d4 + 19.0;
    ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lGroups,local_d8);
    if (((*ppCVar4)->m_Collapse & 1U) == 0) {
      ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                          (&(in_RDI->m_Map).m_lGroups,local_d8);
      iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(*ppCVar4)->m_lLayers);
      local_d4 = (float)iVar2 * 14.0 + local_d4;
    }
  }
  if (in_XMM1_Db < local_d4) {
    CUIRect::VSplitRight
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
               (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f5608);
    CUIRect::VSplitRight
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
               (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f5624);
    UI(in_RDI);
    RenderLayers::s_ScrollValue =
         CUI::DoScrollbarV((CUI *)in_stack_fffffffffffffe48,
                           (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                           in_stack_fffffffffffffe38,
                           (float)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    UI(in_RDI);
    bVar1 = CUI::MouseInside((CUI *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             (CUIRect *)in_stack_fffffffffffffe08);
    if (!bVar1) {
      UI(in_RDI);
      bVar1 = CUI::MouseInside((CUI *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                               (CUIRect *)in_stack_fffffffffffffe08);
      if (!bVar1) goto LAB_001f5797;
    }
    iVar2 = (int)((local_d4 - in_XMM1_Db) / 15.0) + 1;
    if (0 < iVar2) {
      pIVar7 = Input(in_RDI);
      uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[5])(pIVar7,0x1a4,0);
      if ((uVar3 & 1) != 0) {
        RenderLayers::s_ScrollValue =
             clamp<float>(RenderLayers::s_ScrollValue - 1.0 / (float)iVar2,0.0,1.0);
      }
      pIVar7 = Input(in_RDI);
      uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[5])(pIVar7,0x1a5,0);
      if ((uVar3 & 1) != 0) {
        RenderLayers::s_ScrollValue =
             clamp<float>(RenderLayers::s_ScrollValue + 1.0 / (float)iVar2,0.0,1.0);
      }
    }
  }
LAB_001f5797:
  local_e4 = (local_d4 - in_XMM1_Db) * RenderLayers::s_ScrollValue;
  if (local_e4 < 0.0) {
    local_e4 = 0.0;
  }
  local_d4 = -(local_d4 - in_XMM1_Db) * (1.0 - RenderLayers::s_ScrollValue) + local_d4;
  local_ec = 0.0;
  local_f0 = 0;
  while ((iVar2 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size
                            (&(in_RDI->m_Map).m_lGroups), (int)local_f0 < iVar2 &&
         (local_ec <= local_d4))) {
    ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lGroups,local_f0);
    iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(*ppCVar4)->m_lLayers);
    if (local_e4 <= (float)iVar2 * 14.0 + local_ec + 19.0) {
      if (local_e4 <= local_ec) {
        CUIRect::HSplitTop(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                           (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f597b);
        CUIRect::VSplitLeft(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                            (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f599b);
        array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                  (&(in_RDI->m_Map).m_lGroups,local_f0);
        array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                  (&(in_RDI->m_Map).m_lGroups,local_f0);
        array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                  (&(in_RDI->m_Map).m_lGroups,local_f0);
        pcVar10 = "Toggle group visibility";
        iVar2 = DoButton_Ex(in_stack_fffffffffffffe48,
                            (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            (char *)in_stack_fffffffffffffe38,
                            (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                            (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                            ,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                            SUB84(in_stack_fffffffffffffe20,0));
        if (iVar2 != 0) {
          ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                              (&(in_RDI->m_Map).m_lGroups,local_f0);
          bVar13 = (*ppCVar4)->m_Visible ^ 0xff;
          ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                              (&(in_RDI->m_Map).m_lGroups,local_f0);
          (*ppCVar4)->m_Visible = (bool)(bVar13 & 1);
        }
        CUIRect::VSplitRight
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,(CUIRect *)pcVar10,
                   (CUIRect *)0x1f5b1c);
        array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                  (&(in_RDI->m_Map).m_lGroups,local_f0);
        array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                  (&(in_RDI->m_Map).m_lGroups,local_f0);
        iVar2 = DoButton_Ex(in_stack_fffffffffffffe48,
                            (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            (char *)in_stack_fffffffffffffe38,
                            (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                            (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                            ,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                            SUB84(in_stack_fffffffffffffe20,0));
        if ((iVar2 != 0) &&
           (ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_f0),
           ((*ppCVar4)->m_GameGroup & 1U) == 0)) {
          ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                              (&(in_RDI->m_Map).m_lGroups,local_f0);
          bVar1 = (*ppCVar4)->m_SaveToMap;
          ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                              (&(in_RDI->m_Map).m_lGroups,local_f0);
          (*ppCVar4)->m_SaveToMap = (bool)((bVar1 ^ 0xffU) & 1);
        }
        ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                            (&(in_RDI->m_Map).m_lGroups,local_f0);
        str_format(&stack0xffffffffffffffb8,0x40,"#%d %s",(ulong)local_f0,(*ppCVar4)->m_aName);
        pIVar5 = TextRender(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[6])
                  (pIVar5,&stack0xffffffffffffffb8,0xffffffff);
        clamp<float>((local_70 * 10.0) / extraout_XMM0_Da,6.0,10.0);
        array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                  (&(in_RDI->m_Map).m_lGroups,local_f0);
        ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                            (&(in_RDI->m_Map).m_lGroups,local_f0);
        in_stack_fffffffffffffe08 = "Select group. Double click to collapse.";
        if (((*ppCVar4)->m_Collapse & 1U) != 0) {
          in_stack_fffffffffffffe08 = "Select group. Double click to expand.";
        }
        iVar2 = DoButton_Ex(in_stack_fffffffffffffe48,
                            (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            (char *)in_stack_fffffffffffffe38,
                            (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                            (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                            ,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                            SUB84(in_stack_fffffffffffffe20,0));
        if (iVar2 != 0) {
          in_RDI->m_SelectedGroup = local_f0;
          in_RDI->m_SelectedLayer = 0;
          if (iVar2 == 2) {
            UI(in_RDI);
            pCVar6 = UI(in_RDI);
            CUI::MouseX(pCVar6);
            pCVar6 = UI(in_RDI);
            CUI::MouseY(pCVar6);
            pcVar11 = PopupGroup;
            CUI::DoPopupMenu(in_stack_fffffffffffffe30,(int)in_stack_fffffffffffffe2c,
                             in_stack_fffffffffffffe28,
                             (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                             (int)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                             (_func_bool_void_ptr_CUIRect *)
                             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                             (int)in_stack_fffffffffffffe48);
            in_stack_fffffffffffffe08 = (char *)pcVar11;
          }
          ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                              (&(in_RDI->m_Map).m_lGroups,local_f0);
          iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(*ppCVar4)->m_lLayers);
          if (iVar2 != 0) {
            pIVar7 = Input(in_RDI);
            uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[0xb])();
            if ((uVar3 & 1) != 0) {
              ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                  (&(in_RDI->m_Map).m_lGroups,local_f0);
              (*ppCVar4)->m_Collapse = ((*ppCVar4)->m_Collapse & 1U) != 1;
            }
          }
        }
        CUIRect::HSplitTop(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                           (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f5f64);
      }
      local_ec = local_ec + 14.0;
      local_fc = 0;
      while( true ) {
        ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                            (&(in_RDI->m_Map).m_lGroups,local_f0);
        iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(*ppCVar4)->m_lLayers);
        if ((iVar2 <= local_fc) || (local_d4 < local_ec)) break;
        if (local_e4 <= local_ec) {
          ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                              (&(in_RDI->m_Map).m_lGroups,local_f0);
          if (((*ppCVar4)->m_Collapse & 1U) == 0) {
            CUIRect::HSplitTop(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                               (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f606a);
            Checked = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
            CUIRect::VSplitLeft(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                                (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f608b);
            CUIRect::VSplitLeft(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                                (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f60ab);
            ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_f0);
            ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                (&(*ppCVar4)->m_lLayers,local_fc);
            in_stack_fffffffffffffe70 = &(*ppCVar8)->m_Visible;
            ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_f0);
            array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                      (&(*ppCVar4)->m_lLayers,local_fc);
            pcVar10 = "Toggle layer visibility";
            iVar2 = DoButton_Ex(in_stack_fffffffffffffe48,
                                (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40
                                                ),(char *)in_stack_fffffffffffffe38,Checked,
                                (CUIRect *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                                in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                                SUB84(in_stack_fffffffffffffe20,0));
            if (iVar2 != 0) {
              ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                  (&(in_RDI->m_Map).m_lGroups,local_f0);
              ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                  (&(*ppCVar4)->m_lLayers,local_fc);
              bVar1 = (*ppCVar8)->m_Visible;
              ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                  (&(in_RDI->m_Map).m_lGroups,local_f0);
              ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                  (&(*ppCVar4)->m_lLayers,local_fc);
              (*ppCVar8)->m_Visible = (bool)((bVar1 ^ 0xffU) & 1);
            }
            CUIRect::VSplitRight
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,(CUIRect *)pcVar10,
                       (CUIRect *)0x1f6222);
            ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_f0);
            array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                      (&(*ppCVar4)->m_lLayers,local_fc);
            ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_f0);
            array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                      (&(*ppCVar4)->m_lLayers,local_fc);
            pcVar10 = "Enable/disable layer for saving";
            uVar12 = 10;
            iVar2 = DoButton_Ex(in_stack_fffffffffffffe48,
                                (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40
                                                ),(char *)in_stack_fffffffffffffe38,Checked,
                                (CUIRect *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                                in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                                SUB84(in_stack_fffffffffffffe20,0));
            if (iVar2 != 0) {
              ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                  (&(in_RDI->m_Map).m_lGroups,local_f0);
              ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                  (&(*ppCVar4)->m_lLayers,local_fc);
              if (*ppCVar8 != (CLayer *)(in_RDI->m_Map).m_pGameLayer) {
                ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                    (&(in_RDI->m_Map).m_lGroups,local_f0);
                ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                    (&(*ppCVar4)->m_lLayers,local_fc);
                bVar1 = (*ppCVar8)->m_SaveToMap;
                ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                    (&(in_RDI->m_Map).m_lGroups,local_f0);
                ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                    (&(*ppCVar4)->m_lLayers,local_fc);
                (*ppCVar8)->m_SaveToMap = (bool)((bVar1 ^ 0xffU) & 1);
              }
            }
            ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_f0);
            ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                (&(*ppCVar4)->m_lLayers,local_fc);
            if ((*ppCVar8)->m_aName[0] == '\0') {
              ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                  (&(in_RDI->m_Map).m_lGroups,local_f0);
              ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                  (&(*ppCVar4)->m_lLayers,local_fc);
              if ((*ppCVar8)->m_Type == 2) {
                str_copy((char *)CONCAT44(in_stack_fffffffffffffe14,uVar12),pcVar10,0);
              }
              else {
                str_copy((char *)CONCAT44(in_stack_fffffffffffffe14,uVar12),pcVar10,0);
              }
            }
            else {
              in_stack_fffffffffffffe48 = (CEditor *)&stack0xffffffffffffffb8;
              ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                  (&(in_RDI->m_Map).m_lGroups,local_f0);
              ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                  (&(*ppCVar4)->m_lLayers,local_fc);
              str_format((char *)in_stack_fffffffffffffe48,0x40,"%s",(*ppCVar8)->m_aName);
            }
            in_stack_fffffffffffffe2c = local_80 * 10.0;
            pIVar5 = TextRender(in_RDI);
            (*(pIVar5->super_IInterface)._vptr_IInterface[6])
                      (pIVar5,&stack0xffffffffffffffb8,0xffffffff);
            clamp<float>(in_stack_fffffffffffffe2c / extraout_XMM0_Da_00,6.0,10.0);
            ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_f0);
            ppCVar8 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                (&(*ppCVar4)->m_lLayers,local_fc);
            in_stack_fffffffffffffe30 = (CUI *)*ppCVar8;
            in_stack_fffffffffffffe38 = (CUIRect *)&stack0xffffffffffffffb8;
            in_stack_fffffffffffffe47 = false;
            if (local_f0 == in_RDI->m_SelectedGroup) {
              in_stack_fffffffffffffe47 = local_fc == in_RDI->m_SelectedLayer;
            }
            in_stack_fffffffffffffe08 = "Select layer.";
            iVar2 = DoButton_Ex(in_stack_fffffffffffffe48,
                                (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40
                                                ),(char *)in_stack_fffffffffffffe38,
                                (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                (CUIRect *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                                in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                                SUB84(in_stack_fffffffffffffe20,0));
            if (iVar2 != 0) {
              in_RDI->m_SelectedLayer = local_fc;
              in_RDI->m_SelectedGroup = local_f0;
              if (iVar2 == 2) {
                in_stack_fffffffffffffe20 = UI(in_RDI);
                pCVar6 = UI(in_RDI);
                fVar9 = CUI::MouseX(pCVar6);
                in_stack_fffffffffffffe28 = (int)fVar9;
                pCVar6 = UI(in_RDI);
                CUI::MouseY(pCVar6);
                pcVar11 = PopupLayer;
                CUI::DoPopupMenu(in_stack_fffffffffffffe30,(int)in_stack_fffffffffffffe2c,
                                 in_stack_fffffffffffffe28,
                                 (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                                 (int)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                                 (_func_bool_void_ptr_CUIRect *)
                                 CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                                 (int)in_stack_fffffffffffffe48);
                in_stack_fffffffffffffe08 = (char *)pcVar11;
              }
            }
            local_ec = local_ec + 14.0;
            CUIRect::HSplitTop(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                               (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f66e9);
          }
        }
        else {
          local_ec = local_ec + 14.0;
        }
        local_fc = local_fc + 1;
      }
      if ((local_e4 < local_ec) && (local_ec < local_d4)) {
        CUIRect::HSplitTop(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                           (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f6749);
      }
      local_ec = local_ec + 5.0;
    }
    else {
      ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                          (&(in_RDI->m_Map).m_lGroups,local_f0);
      iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(*ppCVar4)->m_lLayers);
      local_ec = (float)iVar2 * 14.0 + 19.0 + local_ec;
    }
    local_f0 = local_f0 + 1;
  }
  if (local_ec <= local_d4) {
    CUIRect::HSplitTop(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                       (CUIRect *)in_stack_fffffffffffffe08,(CUIRect *)0x1f67b4);
    iVar2 = DoButton_Editor(in_stack_fffffffffffffe48,
                            (void *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            (char *)in_stack_fffffffffffffe38,
                            (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                            (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                            ,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                            in_stack_fffffffffffffe70);
    if (iVar2 != 0) {
      CEditorMap::NewGroup((CEditorMap *)in_stack_fffffffffffffe30);
      iVar2 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size
                        (&(in_RDI->m_Map).m_lGroups);
      in_RDI->m_SelectedGroup = iVar2 + -1;
    }
  }
  if (*(IStorage **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderLayers(CUIRect ToolBox, CUIRect View)
{
	CUIRect LayersBox = ToolBox;
	CUIRect Slot, Button;
	char aBuf[64];

	float LayersHeight = 12.0f;	 // Height of AddGroup button
	static float s_ScrollValue = 0;

	for(int g = 0; g < m_Map.m_lGroups.size(); g++)
	{
		// Each group is 19.0f
		// Each layer is 14.0f
		LayersHeight += 19.0f;
		if(!m_Map.m_lGroups[g]->m_Collapse)
			LayersHeight += m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f;
	}

	float ScrollDifference = LayersHeight - LayersBox.h;

	if(LayersHeight > LayersBox.h)	// Do we even need a scrollbar?
	{
		CUIRect Scroll;
		LayersBox.VSplitRight(15.0f, &LayersBox, &Scroll);
		LayersBox.VSplitRight(3.0f, &LayersBox, 0);	// extra spacing
		s_ScrollValue = UI()->DoScrollbarV(&s_ScrollValue, &Scroll, s_ScrollValue);

		if(UI()->MouseInside(&Scroll) || UI()->MouseInside(&LayersBox))
		{
			int ScrollNum = (int)((LayersHeight-LayersBox.h)/15.0f)+1;
			if(ScrollNum > 0)
			{
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_UP))
					s_ScrollValue = clamp(s_ScrollValue - 1.0f/ScrollNum, 0.0f, 1.0f);
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_DOWN))
					s_ScrollValue = clamp(s_ScrollValue + 1.0f/ScrollNum, 0.0f, 1.0f);
			}
		}
	}

	float LayerStartAt = ScrollDifference * s_ScrollValue;
	if(LayerStartAt < 0.0f)
		LayerStartAt = 0.0f;

	float LayerStopAt = LayersHeight - ScrollDifference * (1 - s_ScrollValue);
	float LayerCur = 0;

	// render layers
	{
		for(int g = 0; g < m_Map.m_lGroups.size(); g++)
		{
			if(LayerCur > LayerStopAt)
				break;
			else if(LayerCur + m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f + 19.0f < LayerStartAt)
			{
				LayerCur += m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f + 19.0f;
				continue;
			}

			CUIRect VisibleToggle, SaveCheck;
			if(LayerCur >= LayerStartAt)
			{
				LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);
				Slot.VSplitLeft(12, &VisibleToggle, &Slot);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_Visible, m_Map.m_lGroups[g]->m_Visible?"V":"H", m_Map.m_lGroups[g]->m_Collapse ? 1 : 0, &VisibleToggle, 0, "Toggle group visibility", CUIRect::CORNER_L))
					m_Map.m_lGroups[g]->m_Visible = !m_Map.m_lGroups[g]->m_Visible;

				Slot.VSplitRight(12.0f, &Slot, &SaveCheck);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_SaveToMap, "S", m_Map.m_lGroups[g]->m_SaveToMap, &SaveCheck, 0, "Enable/disable group for saving", CUIRect::CORNER_R))
					if(!m_Map.m_lGroups[g]->m_GameGroup)
						m_Map.m_lGroups[g]->m_SaveToMap = !m_Map.m_lGroups[g]->m_SaveToMap;

				str_format(aBuf, sizeof(aBuf),"#%d %s", g, m_Map.m_lGroups[g]->m_aName);
				const float FontSize = clamp(10.0f * Slot.w / TextRender()->TextWidth(10.0f, aBuf, -1), 6.0f, 10.0f);

				if(int Result = DoButton_Ex(&m_Map.m_lGroups[g], aBuf, g==m_SelectedGroup, &Slot,
					BUTTON_CONTEXT, m_Map.m_lGroups[g]->m_Collapse ? "Select group. Double click to expand." : "Select group. Double click to collapse.", 0, FontSize))
				{
					m_SelectedGroup = g;
					m_SelectedLayer = 0;

					if(Result == 2)
						UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 145, 220, this, PopupGroup);

					if(m_Map.m_lGroups[g]->m_lLayers.size() && Input()->MouseDoubleClick())
						m_Map.m_lGroups[g]->m_Collapse ^= 1;
				}
				LayersBox.HSplitTop(2.0f, &Slot, &LayersBox);
			}
			LayerCur += 14.0f;

			for(int i = 0; i < m_Map.m_lGroups[g]->m_lLayers.size(); i++)
			{
				if(LayerCur > LayerStopAt)
					break;
				else if(LayerCur < LayerStartAt)
				{
					LayerCur += 14.0f;
					continue;
				}

				if(m_Map.m_lGroups[g]->m_Collapse)
					continue;

				//visible
				LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);
				Slot.VSplitLeft(12.0f, 0, &Button);
				Button.VSplitLeft(15, &VisibleToggle, &Button);

				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible, m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible?"V":"H", 0, &VisibleToggle, 0, "Toggle layer visibility", CUIRect::CORNER_L))
					m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible = !m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible;

				Button.VSplitRight(12.0f, &Button, &SaveCheck);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap, "S", m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap, &SaveCheck, 0, "Enable/disable layer for saving", CUIRect::CORNER_R))
					if(m_Map.m_lGroups[g]->m_lLayers[i] != m_Map.m_pGameLayer)
						m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap = !m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap;

				if(m_Map.m_lGroups[g]->m_lLayers[i]->m_aName[0])
					str_format(aBuf, sizeof(aBuf), "%s", m_Map.m_lGroups[g]->m_lLayers[i]->m_aName);
				else if(m_Map.m_lGroups[g]->m_lLayers[i]->m_Type == LAYERTYPE_TILES)
					str_copy(aBuf, "Tiles", sizeof(aBuf));
				else
					str_copy(aBuf, "Quads", sizeof(aBuf));

				const float FontSize = clamp(10.0f * Button.w / TextRender()->TextWidth(10.0f, aBuf, -1), 6.0f, 10.0f);

				if(int Result = DoButton_Ex(m_Map.m_lGroups[g]->m_lLayers[i], aBuf, g==m_SelectedGroup&&i==m_SelectedLayer, &Button,
					BUTTON_CONTEXT, "Select layer.", 0, FontSize))
				{
					m_SelectedLayer = i;
					m_SelectedGroup = g;
					if(Result == 2)
						UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 245, this, PopupLayer);
				}

				LayerCur += 14.0f;
				LayersBox.HSplitTop(2.0f, &Slot, &LayersBox);
			}
			if(LayerCur > LayerStartAt && LayerCur < LayerStopAt)
				LayersBox.HSplitTop(5.0f, &Slot, &LayersBox);
			LayerCur += 5.0f;
		}
	}

	if(LayerCur <= LayerStopAt)
	{
		LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);

		static int s_NewGroupButton = 0;
		if(DoButton_Editor(&s_NewGroupButton, "Add group", 0, &Slot, 0, "Adds a new group"))
		{
			m_Map.NewGroup();
			m_SelectedGroup = m_Map.m_lGroups.size()-1;
		}
	}
}